

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<bool,_false,_false>::DirectGetItem(TypedArray<bool,_false,_false> *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  ArrayBufferBase *pAVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  JavascriptBoolean *local_50;
  bool *typedBuffer;
  uint32 index_local;
  TypedArray<bool,_false,_false> *this_local;
  
  uVar3 = ArrayObject::GetLength((ArrayObject *)this);
  if (index < uVar3) {
    uVar3 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
    pAVar5 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    uVar4 = (*(pAVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar4 < (ulong)(index + 1) + (ulong)uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0xccf,
                                  "((index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (((this->super_TypedArrayBase).buffer[index] & 1) == 0) {
      pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      local_50 = JavascriptLibraryBase::GetFalse(&pJVar7->super_JavascriptLibraryBase);
    }
    else {
      pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      local_50 = JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
    }
    this_local = (TypedArray<bool,_false,_false> *)local_50;
  }
  else {
    pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (TypedArray<bool,_false,_false> *)
                 JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  return this_local;
}

Assistant:

inline Var BoolArray::DirectGetItem(__in uint32 index)
    {
        if (index < GetLength())
        {
            Assert((index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            bool* typedBuffer = (bool*)buffer;
            return typedBuffer[index] ? GetLibrary()->GetTrue() : GetLibrary()->GetFalse();
        }
        return GetLibrary()->GetUndefined();
    }